

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

void __thiscall
asmjit::v1_14::JitAllocatorBlock::markShrunkArea
          (JitAllocatorBlock *this,uint32_t shrunkAreaStart,uint32_t shrunkAreaEnd)

{
  JitAllocatorPool *pJVar1;
  bool bVar2;
  uint uVar3;
  uint in_EDX;
  uint in_ESI;
  JitAllocatorBlock *in_RDI;
  uint32_t shrunkAreaSize;
  char *in_stack_00000310;
  int in_stack_0000031c;
  char *in_stack_00000320;
  uint32_t local_e0;
  uint32_t local_dc;
  uint local_b8;
  uint local_b4 [3];
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  undefined8 local_90;
  undefined1 local_81;
  ulong local_80;
  BitWord *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  undefined1 local_49;
  ulong local_48;
  BitWord *local_40;
  uint *local_38;
  uint32_t *local_30;
  uint *local_28;
  uint32_t *local_20;
  ulong local_18;
  ulong local_10;
  unsigned_long *local_8;
  
  uVar3 = in_EDX - in_ESI;
  if (in_ESI == 0) {
    DebugUtils::assertionFailed(in_stack_00000320,in_stack_0000031c,in_stack_00000310);
  }
  if (uVar3 != 0) {
    pJVar1 = in_RDI->_pool;
    local_b8 = in_EDX;
    local_b4[0] = in_ESI;
    bVar2 = hasLargePages((JitAllocatorBlock *)0x149260);
    pJVar1->totalAreaUsed[bVar2] = pJVar1->totalAreaUsed[bVar2] - (ulong)uVar3;
    in_RDI->_areaUsed = in_RDI->_areaUsed - uVar3;
    local_30 = &in_RDI->_searchStart;
    local_38 = local_b4;
    if (local_b4[0] < *local_30) {
      local_dc = local_b4[0];
    }
    else {
      local_dc = *local_30;
    }
    in_RDI->_searchStart = local_dc;
    local_20 = &in_RDI->_searchEnd;
    local_28 = &local_b8;
    if (*local_20 < local_b8) {
      local_e0 = local_b8;
    }
    else {
      local_e0 = *local_20;
    }
    in_RDI->_searchEnd = local_e0;
    local_8 = in_RDI->_usedBitVector;
    local_10 = (ulong)local_b4[0];
    local_18 = (ulong)uVar3;
    Support::Internal::
    bitVectorOp<unsigned_long,asmjit::v1_14::Support::AndNot,asmjit::v1_14::Support::SetNot>
              (local_8,local_10,local_18);
    local_40 = in_RDI->_stopBitVector;
    local_48 = (ulong)(local_b8 - 1);
    local_49 = 0;
    local_58 = 0x40;
    local_60 = (ulong)(local_b8 - 1 >> 6);
    local_68 = local_48 & 0x3f;
    local_70 = 1L << (sbyte)local_68;
    local_40[local_60] = (local_70 ^ 0xffffffffffffffff) & local_40[local_60];
    local_78 = in_RDI->_stopBitVector;
    local_80 = (ulong)(local_b4[0] - 1);
    local_81 = 1;
    local_90 = 0x40;
    local_98 = (ulong)(local_b4[0] - 1 >> 6);
    local_a0 = local_80 & 0x3f;
    local_a8 = 1L << (sbyte)local_a0;
    local_78[local_98] = local_a8 | local_78[local_98];
    addFlags(in_RDI,4);
    return;
  }
  DebugUtils::assertionFailed(in_stack_00000320,in_stack_0000031c,in_stack_00000310);
}

Assistant:

inline void markShrunkArea(uint32_t shrunkAreaStart, uint32_t shrunkAreaEnd) noexcept {
    uint32_t shrunkAreaSize = shrunkAreaEnd - shrunkAreaStart;

    // Shrunk area cannot start at zero as it would mean that we have shrunk the first
    // block to zero bytes, which is not allowed as such block must be released instead.
    ASMJIT_ASSERT(shrunkAreaStart != 0);
    ASMJIT_ASSERT(shrunkAreaSize != 0);

    // Update the search region and statistics.
    _pool->totalAreaUsed[size_t(hasLargePages())] -= shrunkAreaSize;
    _areaUsed -= shrunkAreaSize;
    _searchStart = Support::min(_searchStart, shrunkAreaStart);
    _searchEnd = Support::max(_searchEnd, shrunkAreaEnd);

    // Unmark the released space and move the sentinel.
    Support::bitVectorClear(_usedBitVector, shrunkAreaStart, shrunkAreaSize);
    Support::bitVectorSetBit(_stopBitVector, shrunkAreaEnd - 1, false);
    Support::bitVectorSetBit(_stopBitVector, shrunkAreaStart - 1, true);

    addFlags(kFlagDirty);
  }